

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transform_copy.cpp
# Opt level: O3

void __thiscall
duckdb::Transformer::TransformCopyOptions
          (Transformer *this,CopyInfo *info,optional_ptr<duckdb_libpgquery::PGList,_true> options)

{
  string *psVar1;
  int iVar2;
  ParserException *this_00;
  _Alloc_hider _Var3;
  PGListCell *pPVar4;
  optional_ptr<duckdb_libpgquery::PGDefElem,_true> def_elem;
  optional_ptr<duckdb_libpgquery::PGValue,_true> format_val;
  string name;
  allocator local_a1;
  optional_ptr<duckdb_libpgquery::PGDefElem,_true> local_a0;
  PGNode *local_98;
  string local_90;
  string local_70;
  string *local_50;
  case_insensitive_map_t<vector<Value>_> *local_48;
  Transformer *local_40;
  optional_ptr<duckdb_libpgquery::PGList,_true> local_38;
  
  if (options.ptr != (PGList *)0x0) {
    local_40 = this;
    local_38.ptr = options.ptr;
    optional_ptr<duckdb_libpgquery::PGList,_true>::CheckValid(&local_38);
    pPVar4 = (local_38.ptr)->head;
    if (pPVar4 != (PGListCell *)0x0) {
      local_48 = &info->options;
      local_50 = (string *)&info->format;
      do {
        local_a0.ptr = (PGDefElem *)(pPVar4->data).ptr_value;
        optional_ptr<duckdb_libpgquery::PGDefElem,_true>::CheckValid(&local_a0);
        ::std::__cxx11::string::string
                  ((string *)&local_70,(local_a0.ptr)->defname,(allocator *)&local_98);
        StringUtil::Lower(&local_90,&local_70);
        iVar2 = ::std::__cxx11::string::compare((char *)&local_90);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_90._M_dataplus._M_p != &local_90.field_2) {
          operator_delete(local_90._M_dataplus._M_p);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_70._M_dataplus._M_p != &local_70.field_2) {
          operator_delete(local_70._M_dataplus._M_p);
        }
        if (iVar2 == 0) {
          optional_ptr<duckdb_libpgquery::PGDefElem,_true>::CheckValid(&local_a0);
          local_98 = (local_a0.ptr)->arg;
          if (local_98 == (PGNode *)0x0) {
LAB_0079043e:
            this_00 = (ParserException *)__cxa_allocate_exception(0x10);
            local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
            ::std::__cxx11::string::_M_construct<char_const*>
                      ((string *)&local_90,
                       "Unsupported parameter type for FORMAT: expected e.g. FORMAT \'csv\', \'parquet\'"
                       ,"");
            ParserException::ParserException(this_00,&local_90);
            __cxa_throw(this_00,&ParserException::typeinfo,::std::runtime_error::~runtime_error);
          }
          optional_ptr<duckdb_libpgquery::PGValue,_true>::CheckValid
                    ((optional_ptr<duckdb_libpgquery::PGValue,_true> *)&local_98);
          if (local_98->type != T_PGString) goto LAB_0079043e;
          optional_ptr<duckdb_libpgquery::PGValue,_true>::CheckValid
                    ((optional_ptr<duckdb_libpgquery::PGValue,_true> *)&local_98);
          ::std::__cxx11::string::string((string *)&local_70,*(char **)(local_98 + 2),&local_a1);
          StringUtil::Lower(&local_90,&local_70);
          ::std::__cxx11::string::operator=(local_50,(string *)&local_90);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_90._M_dataplus._M_p != &local_90.field_2) {
            operator_delete(local_90._M_dataplus._M_p);
          }
          psVar1 = &local_70;
          _Var3._M_p = local_70._M_dataplus._M_p;
        }
        else {
          optional_ptr<duckdb_libpgquery::PGDefElem,_true>::CheckValid(&local_a0);
          ::std::__cxx11::string::string
                    ((string *)&local_90,(local_a0.ptr)->defname,(allocator *)&local_70);
          optional_ptr<duckdb_libpgquery::PGDefElem,_true>::CheckValid(&local_a0);
          ParseGenericOptionListEntry(local_40,local_48,&local_90,(local_a0.ptr)->arg);
          psVar1 = &local_90;
          _Var3._M_p = local_90._M_dataplus._M_p;
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)_Var3._M_p != &psVar1->field_2) {
          operator_delete(_Var3._M_p);
        }
        pPVar4 = pPVar4->next;
      } while (pPVar4 != (PGListCell *)0x0);
    }
  }
  return;
}

Assistant:

void Transformer::TransformCopyOptions(CopyInfo &info, optional_ptr<duckdb_libpgquery::PGList> options) {
	if (!options) {
		return;
	}

	duckdb_libpgquery::PGListCell *cell;
	// iterate over each option
	for_each_cell(cell, options->head) {
		auto def_elem = PGPointerCast<duckdb_libpgquery::PGDefElem>(cell->data.ptr_value);
		if (StringUtil::Lower(def_elem->defname) == "format") {
			// format specifier: interpret this option
			auto format_val = PGPointerCast<duckdb_libpgquery::PGValue>(def_elem->arg);
			if (!format_val || format_val->type != duckdb_libpgquery::T_PGString) {
				throw ParserException("Unsupported parameter type for FORMAT: expected e.g. FORMAT 'csv', 'parquet'");
			}
			info.format = StringUtil::Lower(format_val->val.str);
			continue;
		}

		// The rest ends up in the options
		string name = def_elem->defname;
		ParseGenericOptionListEntry(info.options, name, def_elem->arg);
	}
}